

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O1

void pybind11::detail::loader_life_support::add_patient(handle h)

{
  __hashtable *__h;
  Py_tss_t *pPVar1;
  long lVar2;
  cast_error *this;
  long *in_RDI;
  pair<std::__detail::_Node_iterator<_object_*,_true,_false>,_bool> pVar3;
  __node_gen_type __node_gen;
  long *local_20;
  _Hashtable<_object*,_object*,std::allocator<_object*>,std::__detail::_Identity,std::equal_to<_object*>,std::hash<_object*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_18;
  
  local_20 = in_RDI;
  pPVar1 = get_stack_tls_key();
  lVar2 = PyThread_tss_get(pPVar1);
  if (lVar2 != 0) {
    local_18 = (_Hashtable<_object*,_object*,std::allocator<_object*>,std::__detail::_Identity,std::equal_to<_object*>,std::hash<_object*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)(lVar2 + 8);
    pVar3 = std::
            _Hashtable<_object*,_object*,std::allocator<_object*>,std::__detail::_Identity,std::equal_to<_object*>,std::hash<_object*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<_object*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<_object*,false>>>>
                      (local_18,&local_20);
    if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *local_20 = *local_20 + 1;
    }
    return;
  }
  this = (cast_error *)__cxa_allocate_exception(0x10);
  cast_error::runtime_error
            (this,
             "When called outside a bound function, py::cast() cannot do Python -> C++ conversions which require the creation of temporary values"
            );
  __cxa_throw(this,&cast_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

PYBIND11_NOINLINE static void add_patient(handle h) {
        loader_life_support *frame = get_stack_top();
        if (!frame) {
            // NOTE: It would be nice to include the stack frames here, as this indicates
            // use of pybind11::cast<> outside the normal call framework, finding such
            // a location is challenging. Developers could consider printing out
            // stack frame addresses here using something like __builtin_frame_address(0)
            throw cast_error("When called outside a bound function, py::cast() cannot "
                             "do Python -> C++ conversions which require the creation "
                             "of temporary values");
        }

        if (frame->keep_alive.insert(h.ptr()).second) {
            Py_INCREF(h.ptr());
        }
    }